

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_seed.c
# Opt level: O0

long sd_psupp(int child,long skip_count)

{
  undefined4 in_EDI;
  int j;
  long unaff_retaddr;
  undefined4 local_14;
  undefined4 in_stack_fffffffffffffff8;
  
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    NthElement(unaff_retaddr,(long *)CONCAT44(in_EDI,in_stack_fffffffffffffff8));
    NthElement(unaff_retaddr,(long *)CONCAT44(in_EDI,in_stack_fffffffffffffff8));
  }
  NthElement(unaff_retaddr,(long *)CONCAT44(in_EDI,in_stack_fffffffffffffff8));
  return 0;
}

Assistant:

long
sd_psupp(int child, long skip_count)
	{
	int j;
	
	UNUSED(child);
	for (j=0; j < SUPP_PER_PART; j++)
		{
		ADVANCE_STREAM(PS_QTY_SD, skip_count);
		ADVANCE_STREAM(PS_SCST_SD, skip_count);
		}
	FAKE_V_STR(PS_CMNT_LEN, PS_CMNT_SD, skip_count);

	return(0L);
	}